

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

char * stripslashes(char *str,_Bool local)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(str,0x2f);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = str;
  }
  return pcVar2;
}

Assistant:

char *stripslashes(const char *str, bool local)
{
    char *p;

    /*
     * On Unix, we do the same thing regardless of the 'local'
     * parameter.
     */
    p = strrchr(str, '/');
    if (p) str = p+1;

    return (char *)str;
}